

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O1

void TestEmbedType<EMBED_X509_NAME,X509_name_st,X509_name_st,stack_st_X509_NAME>
               (Span<const_unsigned_char> inp,_func_int_X509_name_st_ptr_uint8_t_ptr_ptr *i2d,
               _func_EMBED_X509_NAME_ptr *embed_new,_func_void_EMBED_X509_NAME_ptr *embed_free,
               _func_EMBED_X509_NAME_ptr_EMBED_X509_NAME_ptr_ptr_uint8_t_ptr_ptr_long *d2i_embed,
               _func_int_EMBED_X509_NAME_ptr_uint8_t_ptr_ptr *i2d_embed,
               _func_size_t_stack_st_X509_NAME_ptr *sk_num,
               _func_X509_name_st_ptr_stack_st_X509_NAME_ptr_size_t *sk_value)

{
  int iVar1;
  size_t sVar2;
  EMBED_X509_NAME *pEVar3;
  uint8_t *puVar4;
  size_t sVar5;
  EMBED_X509_NAME *obj;
  X509_name_st *pXVar6;
  uint8_t *puVar7;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar9;
  pointer message;
  _func_EMBED_X509_NAME_ptr_EMBED_X509_NAME_ptr_ptr_uint8_t_ptr_ptr_long *expected_predicate_value;
  pointer *__ptr_2;
  bool bVar10;
  Span<const_unsigned_char> expected;
  Span<const_unsigned_char> expected_00;
  AssertionResult gtest_ar__8;
  CBB child;
  CBB seq;
  uint8_t *ptr;
  ScopedCBB cbb;
  AssertHelper local_118;
  AssertHelper local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  EMBED_X509_NAME *local_100;
  AssertHelper local_f8;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  anon_union_32_2_4f6aaa2e_for_u local_c0;
  CBB local_a0;
  _func_void_EMBED_X509_NAME_ptr *local_70;
  uint8_t *local_68;
  CBB local_60;
  
  sVar5 = inp.size_;
  puVar7 = inp.data_;
  expected_predicate_value = d2i_embed;
  local_70 = embed_free;
  CBB_zero(&local_60);
  iVar1 = CBB_init(&local_60,0x40);
  local_d0[0] = (internal)(iVar1 != 0);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_a0,(internal *)local_d0,(AssertionResult *)"CBB_init(cbb.get(), 64)"
               ,"false","true",(char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0xbbc,(char *)local_a0.child);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_f0);
  }
  else {
    iVar1 = CBB_add_asn1_element(&local_60,0x20000010,puVar7,sVar5);
    local_d0[0] = (internal)(iVar1 != 0);
    local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_a0,(internal *)local_d0,
                 (AssertionResult *)
                 "CBB_add_asn1_element(cbb.get(), (0x10u | (0x20u << 24)), inp.data(), inp.size())",
                 "false","true",(char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xbbe,(char *)local_a0.child);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)local_f0);
    }
    else {
      iVar1 = CBB_flush(&local_60);
      local_d0[0] = (internal)(iVar1 != 0);
      local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_d0[0]) {
        local_100 = (EMBED_X509_NAME *)0x0;
        local_68 = CBB_data(&local_60);
        local_100 = (EMBED_X509_NAME *)0x0;
        sVar2 = CBB_len(&local_60);
        local_100 = (EMBED_X509_NAME *)0x0;
        pEVar3 = (*d2i_embed)((EMBED_X509_NAME **)0x0,&local_68,sVar2);
        local_d0[0] = (internal)(pEVar3 != (EMBED_X509_NAME *)0x0);
        local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_100 = pEVar3;
        if (pEVar3 == (EMBED_X509_NAME *)0x0) {
          testing::Message::Message((Message *)local_f0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&local_a0,(internal *)local_d0,(AssertionResult *)0x5896f9,"false",
                     "true",(char *)expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0xbc2,(char *)local_a0.child);
          testing::internal::AssertHelper::operator=(&local_110,(Message *)local_f0);
LAB_001ede5b:
          pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8;
          testing::internal::AssertHelper::~AssertHelper(&local_110);
          if (local_a0.child != (CBB *)&local_a0.u) {
            operator_delete(local_a0.child,(ulong)(local_a0.u.base.buf + 1));
          }
          pbVar8 = local_c8;
          if ((long *)CONCAT71(local_f0._1_7_,local_f0[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_f0._1_7_,local_f0[0]) + 8))();
            pbVar8 = local_c8;
          }
        }
        else {
          bVar10 = pEVar3->simple == (X509_NAME *)0x0;
          local_d0[0] = (internal)!bVar10;
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar10) {
            testing::Message::Message((Message *)local_f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_a0,(internal *)local_d0,(AssertionResult *)"obj->simple",
                       "false","true",(char *)expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0xbc3,(char *)local_a0.child);
            testing::internal::AssertHelper::operator=(&local_110,(Message *)local_f0);
            goto LAB_001ede5b;
          }
          TestSerialize<X509_name_st*,X509_name_st*>(pEVar3->simple,i2d,inp);
          local_d0[0] = (internal)(local_100->opt == (X509_NAME *)0x0);
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_d0[0]) {
            testing::Message::Message((Message *)local_f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_a0,(internal *)local_d0,(AssertionResult *)"obj->opt","true"
                       ,"false",(char *)expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0xbc6,(char *)local_a0.child);
            testing::internal::AssertHelper::operator=(&local_110,(Message *)local_f0);
            testing::internal::AssertHelper::~AssertHelper(&local_110);
            if (local_a0.child != (CBB *)&local_a0.u) {
              operator_delete(local_a0.child,(ulong)(local_a0.u.base.buf + 1));
            }
            if ((long *)CONCAT71(local_f0._1_7_,local_f0[0]) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_f0._1_7_,local_f0[0]) + 8))();
            }
          }
          if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c8,local_c8);
          }
          local_d0[0] = (internal)(local_100->seq == (stack_st_X509_NAME *)0x0);
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_d0[0]) {
            testing::Message::Message((Message *)local_f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_a0,(internal *)local_d0,(AssertionResult *)"obj->seq","true"
                       ,"false",(char *)expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0xbc7,(char *)local_a0.child);
            testing::internal::AssertHelper::operator=(&local_110,(Message *)local_f0);
            testing::internal::AssertHelper::~AssertHelper(&local_110);
            if (local_a0.child != (CBB *)&local_a0.u) {
              operator_delete(local_a0.child,(ulong)(local_a0.u.base.buf + 1));
            }
            if ((long *)CONCAT71(local_f0._1_7_,local_f0[0]) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_f0._1_7_,local_f0[0]) + 8))();
            }
          }
          if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c8,local_c8);
          }
          puVar4 = CBB_data(&local_60);
          sVar2 = CBB_len(&local_60);
          expected.size_ = sVar2;
          expected.data_ = puVar4;
          TestSerialize<EMBED_X509_NAME*,EMBED_X509_NAME*>(local_100,i2d_embed,expected);
          CBB_cleanup(&local_60);
          CBB_zero(&local_60);
          iVar1 = CBB_init(&local_60,0x40);
          local_d0[0] = (internal)(iVar1 != 0);
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)local_f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_a0,(internal *)local_d0,
                       (AssertionResult *)"CBB_init(cbb.get(), 64)","false","true",
                       (char *)expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0xbcd,(char *)local_a0.child);
            testing::internal::AssertHelper::operator=(&local_110,(Message *)local_f0);
            goto LAB_001ede5b;
          }
          iVar1 = CBB_add_asn1(&local_60,&local_a0,0x20000010);
          local_f0[0] = (internal)(iVar1 != 0);
          local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_110);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_d0,(internal *)local_f0,
                       (AssertionResult *)"CBB_add_asn1(cbb.get(), &seq, (0x10u | (0x20u << 24)))",
                       "false","true",(char *)expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      (&local_118,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0xbcf,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
            testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
LAB_001edf99:
            pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e8;
            testing::internal::AssertHelper::~AssertHelper(&local_118);
            if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0)
            {
              operator_delete((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_d0._1_7_,local_d0[0])
                              ,(ulong)(local_c0.base.buf + 1));
            }
            pbVar8 = local_e8;
            if (local_110.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_110.data_ + 8))();
              pbVar8 = local_e8;
            }
          }
          else {
            iVar1 = CBB_add_bytes(&local_a0,puVar7,sVar5);
            local_f0[0] = (internal)(iVar1 != 0);
            local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar1 == 0) {
              testing::Message::Message((Message *)&local_110);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_d0,(internal *)local_f0,
                         (AssertionResult *)"CBB_add_bytes(&seq, inp.data(), inp.size())","false",
                         "true",(char *)expected_predicate_value);
              testing::internal::AssertHelper::AssertHelper
                        (&local_118,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0xbd0,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
              testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
              goto LAB_001edf99;
            }
            iVar1 = CBB_add_asn1(&local_a0,(CBB *)local_d0,0xa0000000);
            local_110.data_._0_1_ = iVar1 != 0;
            local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar1 == 0) {
              testing::Message::Message((Message *)&local_118);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_f0,(internal *)&local_110,
                         (AssertionResult *)
                         "CBB_add_asn1( &seq, &child, (0x80u << 24) | (0x20u << 24) | 0)","false",
                         "true",(char *)expected_predicate_value);
              testing::internal::AssertHelper::AssertHelper
                        (&local_f8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0xbd3,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
              testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_118);
            }
            else {
              iVar1 = CBB_add_bytes((CBB *)local_d0,puVar7,sVar5);
              local_110.data_._0_1_ = iVar1 != 0;
              local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar1 == 0) {
                testing::Message::Message((Message *)&local_118);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f0,(internal *)&local_110,
                           (AssertionResult *)"CBB_add_bytes(&child, inp.data(), inp.size())",
                           "false","true",(char *)expected_predicate_value);
                testing::internal::AssertHelper::AssertHelper
                          (&local_f8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0xbd4,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_118);
              }
              else {
                iVar1 = CBB_add_asn1(&local_a0,(CBB *)local_d0,0xa0000001);
                local_110.data_._0_1_ = iVar1 != 0;
                local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&local_118);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_f0,(internal *)&local_110,
                             (AssertionResult *)
                             "CBB_add_asn1( &seq, &child, (0x80u << 24) | (0x20u << 24) | 1)",
                             "false","true",(char *)expected_predicate_value);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_f8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                             ,0xbd6,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                  testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_118);
                }
                else {
                  iVar1 = CBB_add_bytes((CBB *)local_d0,puVar7,sVar5);
                  local_110.data_._0_1_ = iVar1 != 0;
                  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (iVar1 == 0) {
                    testing::Message::Message((Message *)&local_118);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_f0,(internal *)&local_110,
                               (AssertionResult *)"CBB_add_bytes(&child, inp.data(), inp.size())",
                               "false","true",(char *)expected_predicate_value);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_f8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                               ,0xbd7,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_118);
                  }
                  else {
                    iVar1 = CBB_add_bytes((CBB *)local_d0,puVar7,sVar5);
                    local_110.data_._0_1_ = iVar1 != 0;
                    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0;
                    if (iVar1 == 0) {
                      testing::Message::Message((Message *)&local_118);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_f0,(internal *)&local_110,
                                 (AssertionResult *)"CBB_add_bytes(&child, inp.data(), inp.size())",
                                 "false","true",(char *)expected_predicate_value);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_f8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                 ,0xbd8,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_118);
                    }
                    else {
                      iVar1 = CBB_flush(&local_60);
                      local_110.data_._0_1_ = iVar1 != 0;
                      local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0;
                      if (iVar1 != 0) {
                        local_68 = CBB_data(&local_60);
                        sVar5 = CBB_len(&local_60);
                        obj = (*d2i_embed)((EMBED_X509_NAME **)0x0,&local_68,sVar5);
                        if (pEVar3 != (EMBED_X509_NAME *)0x0) {
                          (*local_70)(local_100);
                        }
                        local_110.data_._0_1_ = obj != (EMBED_X509_NAME *)0x0;
                        local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0;
                        pEVar3 = obj;
                        if (obj == (EMBED_X509_NAME *)0x0) {
                          testing::Message::Message((Message *)&local_118);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_f0,(internal *)&local_110,
                                     (AssertionResult *)0x5896f9,"false","true",
                                     (char *)expected_predicate_value);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_f8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                     ,0xbdc,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                          testing::internal::AssertHelper::operator=
                                    (&local_f8,(Message *)&local_118);
LAB_001ee37f:
                          pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_108;
                          testing::internal::AssertHelper::~AssertHelper(&local_f8);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_f0._1_7_,local_f0[0]) != &local_e0) {
                            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)CONCAT71(local_f0._1_7_,local_f0[0]),
                                            local_e0._M_allocated_capacity + 1);
                          }
                          if ((long *)CONCAT44(local_118.data_._4_4_,local_118.data_._0_4_) !=
                              (long *)0x0) {
                            (**(code **)(*(long *)CONCAT44(local_118.data_._4_4_,
                                                           local_118.data_._0_4_) + 8))();
                          }
                          pbVar8 = local_108;
                          if (local_108 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) goto LAB_001edead;
                        }
                        else {
                          bVar10 = obj->simple == (X509_NAME *)0x0;
                          local_110.data_._0_1_ = !bVar10;
                          local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0;
                          if (bVar10) {
                            testing::Message::Message((Message *)&local_118);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_f0,(internal *)&local_110,
                                       (AssertionResult *)"obj->simple","false","true",
                                       (char *)expected_predicate_value);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_f8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                       ,0xbdd,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                            testing::internal::AssertHelper::operator=
                                      (&local_f8,(Message *)&local_118);
                            goto LAB_001ee37f;
                          }
                          local_100 = obj;
                          TestSerialize<X509_name_st*,X509_name_st*>(obj->simple,i2d,inp);
                          bVar10 = obj->opt == (X509_NAME *)0x0;
                          local_110.data_._0_1_ = !bVar10;
                          local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0;
                          if (bVar10) {
                            testing::Message::Message((Message *)&local_118);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_f0,(internal *)&local_110,
                                       (AssertionResult *)"obj->opt","false","true",
                                       (char *)expected_predicate_value);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_f8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                       ,0xbdf,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                            testing::internal::AssertHelper::operator=
                                      (&local_f8,(Message *)&local_118);
                            goto LAB_001ee37f;
                          }
                          local_100 = obj;
                          TestSerialize<X509_name_st*,X509_name_st*>(obj->opt,i2d,inp);
                          local_110.data_ = (AssertHelperData *)(*sk_num)(obj->seq);
                          local_118.data_._0_4_ = 2;
                          testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                                    ((internal *)local_f0,"sk_num(obj->seq)","2u",
                                     (unsigned_long *)&local_110,(uint *)&local_118);
                          if (local_f0[0] != (internal)0x0) {
                            if (local_e8 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_e8,local_e8);
                            }
                            local_100 = obj;
                            pXVar6 = (*sk_value)(obj->seq,0);
                            local_100 = obj;
                            TestSerialize<X509_name_st*,X509_name_st*>(pXVar6,i2d,inp);
                            local_100 = obj;
                            pXVar6 = (*sk_value)(obj->seq,1);
                            local_100 = obj;
                            TestSerialize<X509_name_st*,X509_name_st*>(pXVar6,i2d,inp);
                            local_100 = obj;
                            puVar7 = CBB_data(&local_60);
                            local_100 = obj;
                            sVar5 = CBB_len(&local_60);
                            expected_00.size_ = sVar5;
                            expected_00.data_ = puVar7;
                            local_100 = obj;
                            TestSerialize<EMBED_X509_NAME*,EMBED_X509_NAME*>
                                      (obj,i2d_embed,expected_00);
                            obj = local_100;
                            pEVar3 = local_100;
                            goto LAB_001edead;
                          }
                          testing::Message::Message((Message *)&local_110);
                          if (local_e8 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            message = "";
                          }
                          else {
                            message = (local_e8->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_118,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                     ,0xbe1,message);
                          testing::internal::AssertHelper::operator=
                                    (&local_118,(Message *)&local_110);
                          testing::internal::AssertHelper::~AssertHelper(&local_118);
                          if (local_110.data_ != (AssertHelperData *)0x0) {
                            (**(code **)(*(long *)local_110.data_ + 8))();
                          }
                          if (local_e8 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) goto LAB_001edead;
                          pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_e8;
                          pbVar8 = local_e8;
                        }
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()(pdVar9,pbVar8);
                        goto LAB_001edead;
                      }
                      testing::Message::Message((Message *)&local_118);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_f0,(internal *)&local_110,
                                 (AssertionResult *)"CBB_flush(cbb.get())","false","true",
                                 (char *)expected_predicate_value);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_f8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                 ,0xbd9,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_118);
                    }
                  }
                }
              }
            }
            pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108;
            testing::internal::AssertHelper::~AssertHelper(&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_f0._1_7_,local_f0[0]) != &local_e0) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_f0._1_7_,local_f0[0]),
                              local_e0._M_allocated_capacity + 1);
            }
            pbVar8 = local_108;
            if ((long *)CONCAT44(local_118.data_._4_4_,local_118.data_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_118.data_._4_4_,local_118.data_._0_4_) + 8))();
              pbVar8 = local_108;
            }
          }
        }
        obj = local_100;
        pEVar3 = local_100;
        if (pbVar8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar9,pbVar8);
          obj = local_100;
          pEVar3 = local_100;
        }
        goto LAB_001edead;
      }
      testing::Message::Message((Message *)local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_a0,(internal *)local_d0,(AssertionResult *)"CBB_flush(cbb.get())",
                 "false","true",(char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xbbf,(char *)local_a0.child);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)local_f0);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_110);
  if (local_a0.child != (CBB *)&local_a0.u) {
    operator_delete(local_a0.child,(ulong)(local_a0.u.base.buf + 1));
  }
  if ((long *)CONCAT71(local_f0._1_7_,local_f0[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_f0._1_7_,local_f0[0]) + 8))();
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  obj = (EMBED_X509_NAME *)0x0;
  pEVar3 = local_100;
LAB_001edead:
  local_100 = pEVar3;
  CBB_cleanup(&local_60);
  if (obj != (EMBED_X509_NAME *)0x0) {
    (*local_70)(obj);
  }
  return;
}

Assistant:

void TestEmbedType(bssl::Span<const uint8_t> inp,
                   int (*i2d)(MaybeConstT *, uint8_t **),
                   EmbedT *(*embed_new)(), void (*embed_free)(EmbedT *),
                   EmbedT *(*d2i_embed)(EmbedT **, const uint8_t **, long),
                   int (*i2d_embed)(EmbedT *, uint8_t **),
                   size_t (*sk_num)(const StackT *),
                   T *(*sk_value)(const StackT *, size_t)) {
  std::unique_ptr<EmbedT, decltype(embed_free)> obj(nullptr, embed_free);

  // Test only the first field present.
  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init(cbb.get(), 64));
  ASSERT_TRUE(CBB_add_asn1_element(cbb.get(), CBS_ASN1_SEQUENCE, inp.data(),
                                   inp.size()));
  ASSERT_TRUE(CBB_flush(cbb.get()));
  const uint8_t *ptr = CBB_data(cbb.get());
  obj.reset(d2i_embed(nullptr, &ptr, CBB_len(cbb.get())));
  ASSERT_TRUE(obj);
  ASSERT_TRUE(obj->simple);
  // Test the field was parsed correctly by reserializing it.
  TestSerialize(obj->simple, i2d, inp);
  EXPECT_FALSE(obj->opt);
  EXPECT_FALSE(obj->seq);
  TestSerialize(obj.get(), i2d_embed,
                {CBB_data(cbb.get()), CBB_len(cbb.get())});

  // Test all fields present.
  cbb.Reset();
  ASSERT_TRUE(CBB_init(cbb.get(), 64));
  CBB seq;
  ASSERT_TRUE(CBB_add_asn1(cbb.get(), &seq, CBS_ASN1_SEQUENCE));
  ASSERT_TRUE(CBB_add_bytes(&seq, inp.data(), inp.size()));
  CBB child;
  ASSERT_TRUE(CBB_add_asn1(
      &seq, &child, CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0));
  ASSERT_TRUE(CBB_add_bytes(&child, inp.data(), inp.size()));
  ASSERT_TRUE(CBB_add_asn1(
      &seq, &child, CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 1));
  ASSERT_TRUE(CBB_add_bytes(&child, inp.data(), inp.size()));
  ASSERT_TRUE(CBB_add_bytes(&child, inp.data(), inp.size()));
  ASSERT_TRUE(CBB_flush(cbb.get()));
  ptr = CBB_data(cbb.get());
  obj.reset(d2i_embed(nullptr, &ptr, CBB_len(cbb.get())));
  ASSERT_TRUE(obj);
  ASSERT_TRUE(obj->simple);
  TestSerialize(obj->simple, i2d, inp);
  ASSERT_TRUE(obj->opt);
  TestSerialize(obj->opt, i2d, inp);
  ASSERT_EQ(sk_num(obj->seq), 2u);
  TestSerialize(sk_value(obj->seq, 0), i2d, inp);
  TestSerialize(sk_value(obj->seq, 1), i2d, inp);
  TestSerialize(obj.get(), i2d_embed,
                {CBB_data(cbb.get()), CBB_len(cbb.get())});
}